

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniFB_timer.c
# Opt level: O2

mfb_timer * mfb_timer_create(void)

{
  mfb_timer *tmr;
  
  if (mfb_timer_create_once == '\0') {
    mfb_timer_create_once = '\x01';
    mfb_timer_init();
  }
  tmr = (mfb_timer *)malloc(0x18);
  mfb_timer_reset(tmr);
  return tmr;
}

Assistant:

struct mfb_timer *
mfb_timer_create() {
    static int  once = 1;
    mfb_timer   *tmr;

    if(once) {
        once = 0;
        mfb_timer_init();
    }

    tmr = malloc(sizeof(mfb_timer));
    mfb_timer_reset(tmr);

    return tmr;
}